

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

reference __thiscall
immutable::vector_iterator<int,_true,_5>::operator*(vector_iterator<int,_true,_5> *this)

{
  uint uVar1;
  rrb<int,_true,_5> *prVar2;
  long lVar3;
  uint32_t original_index;
  uint uVar4;
  uint32_t uVar5;
  char *__function;
  leaf_node<int,_true> *plVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  
  uVar1 = this->_index;
  uVar4 = (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
          super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
  if ((uVar1 < uVar4) ||
     ((this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl <= uVar1)) {
    prVar2 = (this->_impl).ptr;
    if (prVar2 == (rrb<int,_true,_5> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb<int>>::operator->() const [T = immutable::rrb<int>]";
LAB_0012ddb2:
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,__function);
    }
    uVar8 = prVar2->cnt;
    if (uVar8 <= uVar1) {
      __assert_fail("index < rrb->cnt",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x7e0,
                    "std::tuple<const T *, uint32_t, uint32_t> immutable::rrb_region_for(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = true, N = 5]"
                   );
    }
    uVar4 = uVar8 - prVar2->tail_len;
    if (uVar1 < uVar4) {
      plVar6 = (leaf_node<int,_true> *)(prVar2->root).ptr;
      uVar4 = uVar1;
      for (uVar5 = prVar2->shift; uVar5 != 0; uVar5 = uVar5 - 5) {
        uVar8 = uVar4 >> ((byte)uVar5 & 0x1f);
        if ((long *)plVar6->child == (long *)0x0) {
          plVar10 = (long *)((ulong)((uVar8 & 0x1f) << 3) + *(long *)(plVar6 + 1));
        }
        else {
          lVar3 = *(long *)plVar6->child;
          do {
            uVar9 = uVar8;
            uVar8 = uVar9 + 1;
          } while (*(uint *)(lVar3 + (ulong)uVar9 * 4) <= uVar4);
          if (uVar9 + 1 != 1) {
            uVar4 = uVar4 - *(int *)(lVar3 + (ulong)(uVar9 - 1) * 4);
          }
          plVar10 = (long *)((ulong)uVar9 * 8 + *(long *)(plVar6 + 1));
        }
        plVar6 = (leaf_node<int,_true> *)*plVar10;
      }
      uVar4 = uVar1 - (uVar4 & 0x1f);
      uVar8 = plVar6->len + uVar4;
    }
    else {
      plVar6 = (prVar2->tail).ptr;
      if (plVar6 == (leaf_node<int,_true> *)0x0) {
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
        ;
        goto LAB_0012ddb2;
      }
    }
    piVar7 = plVar6->child;
    (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Head_base<0UL,_const_int_*,_false>._M_head_impl = piVar7;
    (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
    _M_head_impl = uVar4;
    (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl = uVar8;
  }
  else {
    piVar7 = (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
             super__Head_base<0UL,_const_int_*,_false>._M_head_impl;
  }
  return piVar7 + (uVar1 - uVar4);
}

Assistant:

reference operator* () const
        {
        if (_index < std::get<1>(_cursor) || _index >= std::get<2>(_cursor))
          {
          _cursor = rrb_region_for(_impl, _index);
          }
        return std::get<0>(_cursor)[_index - std::get<1>(_cursor)];
        }